

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_FSA_dns.c
# Opt level: O0

int resS(int Ns,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector resval,N_Vector *yyS,N_Vector *ypS,
        N_Vector *resvalS,void *user_data,N_Vector tmp1,N_Vector tmp2,N_Vector tmp3)

{
  void *pvVar1;
  N_Vector_Ops p_Var2;
  SUNContext pSVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long *in_RSI;
  long in_R8;
  long in_R9;
  int local_b4;
  double local_a8;
  double local_a0;
  int is;
  sunrealtype rs3;
  sunrealtype rs2;
  sunrealtype rs1;
  sunrealtype sd2;
  sunrealtype sd1;
  sunrealtype s3;
  sunrealtype s2;
  sunrealtype s1;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  sunrealtype p3;
  sunrealtype p2;
  sunrealtype p1;
  UserData data;
  
  pvVar1 = resval->content;
  p_Var2 = resval->ops;
  pSVar3 = resval->sunctx;
  dVar4 = **(double **)(*in_RSI + 0x10);
  dVar5 = *(double *)(*(long *)(*in_RSI + 0x10) + 8);
  dVar6 = *(double *)(*(long *)(*in_RSI + 0x10) + 0x10);
  for (local_b4 = 0; local_b4 < 3; local_b4 = local_b4 + 1) {
    dVar7 = **(double **)(**(long **)(in_R8 + (long)local_b4 * 8) + 0x10);
    dVar8 = *(double *)(*(long *)(**(long **)(in_R8 + (long)local_b4 * 8) + 0x10) + 8);
    dVar9 = *(double *)(*(long *)(**(long **)(in_R8 + (long)local_b4 * 8) + 0x10) + 0x10);
    local_a0 = (((double)pvVar1 * dVar7 +
                **(double **)(**(long **)(in_R9 + (long)local_b4 * 8) + 0x10)) -
               (double)p_Var2 * dVar6 * dVar8) - (double)p_Var2 * dVar5 * dVar9;
    local_a8 = ((double)pSVar3 + (double)pSVar3) * dVar5 * dVar8 +
               (double)p_Var2 * dVar5 * dVar9 +
               (double)p_Var2 * dVar6 * dVar8 +
               (*(double *)(*(long *)(**(long **)(in_R9 + (long)local_b4 * 8) + 0x10) + 8) -
               (double)pvVar1 * dVar7);
    if (local_b4 == 0) {
      local_a0 = dVar4 + local_a0;
      local_a8 = local_a8 - dVar4;
    }
    else if (local_b4 == 1) {
      local_a0 = -dVar5 * dVar6 + local_a0;
      local_a8 = dVar5 * dVar6 + local_a8;
    }
    else if (local_b4 == 2) {
      local_a8 = dVar5 * dVar5 + local_a8;
    }
    **(double **)((long)yyS[local_b4]->content + 0x10) = local_a0;
    *(double *)(*(long *)((long)yyS[local_b4]->content + 0x10) + 8) = local_a8;
    *(double *)(*(long *)((long)yyS[local_b4]->content + 0x10) + 0x10) = dVar7 + dVar8 + dVar9;
  }
  return 0;
}

Assistant:

static int resS(int Ns, sunrealtype t, N_Vector yy, N_Vector yp,
                N_Vector resval, N_Vector* yyS, N_Vector* ypS, N_Vector* resvalS,
                void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData data;
  sunrealtype p1, p2, p3;
  sunrealtype y1, y2, y3;
  sunrealtype s1, s2, s3;
  sunrealtype sd1, sd2;
  sunrealtype rs1, rs2, rs3;
  int is;

  data = (UserData)user_data;
  p1   = data->p[0];
  p2   = data->p[1];
  p3   = data->p[2];

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);

  for (is = 0; is < NS; is++)
  {
    s1 = Ith(yyS[is], 1);
    s2 = Ith(yyS[is], 2);
    s3 = Ith(yyS[is], 3);

    sd1 = Ith(ypS[is], 1);
    sd2 = Ith(ypS[is], 2);

    rs1 = sd1 + p1 * s1 - p2 * y3 * s2 - p2 * y2 * s3;
    rs2 = sd2 - p1 * s1 + p2 * y3 * s2 + p2 * y2 * s3 + 2 * p3 * y2 * s2;
    rs3 = s1 + s2 + s3;

    switch (is)
    {
    case 0:
      rs1 += y1;
      rs2 -= y1;
      break;
    case 1:
      rs1 -= y2 * y3;
      rs2 += y2 * y3;
      break;
    case 2: rs2 += y2 * y2; break;
    }

    Ith(resvalS[is], 1) = rs1;
    Ith(resvalS[is], 2) = rs2;
    Ith(resvalS[is], 3) = rs3;
  }

  return (0);
}